

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

void __thiscall
pica::Grid<(pica::Dimension)2,_double>::Grid
          (Grid<(pica::Dimension)2,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  undefined8 *in_RDX;
  IndexType *in_RSI;
  IndexType in_RDI;
  Array2d<double> *value;
  ValueType in_stack_ffffffffffffff60;
  IndexType size_00;
  
  size_00 = in_RDI;
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,in_RDI,in_stack_ffffffffffffff60);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,in_stack_ffffffffffffff60);
  value = (Array2d<double> *)((long)in_RDI + 0x40);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  Array2d<double>::Array2d((Array2d<double> *)in_RDI,size_00,(ValueType)value);
  ((Array2d<double> *)((long)in_RDI + 0x120))->size = *in_RSI;
  (((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x128))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)in_RSI[1];
  *(pointer *)((long)in_RDI + 0x130) = (pointer)*in_RDX;
  *(pointer *)((long)in_RDI + 0x138) = (pointer)in_RDX[1];
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}